

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint *bitlen;
  uint *puVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint *puVar14;
  long lVar15;
  uint *bitlen_00;
  ulong __n;
  long lVar16;
  ulong uVar17;
  char cVar18;
  long lVar19;
  uint uVar20;
  ucvector *p;
  bool bVar21;
  HuffmanTree tree_ll;
  LodePNGBitReader local_118;
  uint *local_f0;
  ucvector *local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  HuffmanTree local_b8;
  LodePNGDecompressSettings *local_90;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_118.bitsize = insize * 8;
  uVar5 = 0x69;
  if (local_118.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_118.bp = 0;
    local_118.buffer = 0;
    uVar5 = 0;
    uVar20 = 0;
    uVar6 = 0;
    local_118.data = in;
    local_118.size = insize;
    local_e8 = out;
    local_90 = settings;
    do {
      if (uVar20 != 0) {
        return uVar6;
      }
      uVar4 = ensureBits9(&local_118,3);
      sVar3 = local_118.size;
      if (uVar4 == 0) {
        uVar5 = 0x34;
LAB_0011b170:
        bVar21 = false;
      }
      else {
        uVar20 = local_118.buffer & 1;
        uVar4 = local_118.buffer >> 1 & 3;
        local_118.buffer = local_118.buffer >> 3;
        uVar9 = local_118.bp + 3;
        if (uVar4 == 3) {
          uVar5 = 0x14;
          local_118.bp = uVar9;
          goto LAB_0011b170;
        }
        local_c0 = uVar20;
        local_bc = uVar5;
        if (uVar4 == 0) {
          uVar7 = local_118.bp + 10 >> 3;
          uVar17 = uVar7 + 4;
          uVar6 = 0x34;
          local_118.bp = uVar9;
          if (uVar17 < local_118.size) {
            uVar2 = *(ushort *)(local_118.data + uVar7);
            __n = (ulong)uVar2;
            if ((local_90->ignore_nlen != 0) ||
               (uVar6 = 0x15, (uint)*(ushort *)(local_118.data + uVar7 + 2) + (uint)uVar2 == 0xffff)
               ) {
              uVar5 = ucvector_resize(local_e8,local_e8->size + __n);
              if (uVar5 == 0) {
                uVar6 = 0x53;
              }
              else {
                uVar6 = 0x17;
                if (uVar17 + __n <= sVar3) {
                  if (uVar2 != 0) {
                    memcpy(local_e8->data + (local_e8->size - __n),local_118.data + uVar17,__n);
                  }
                  local_118.bp = (uVar17 + __n) * 8;
                  uVar6 = 0;
                }
              }
            }
          }
        }
        else {
          local_b8.codes = (uint *)0x0;
          local_b8.lengths = (uint *)0x0;
          local_b8.table_len = (uchar *)0x0;
          local_b8.table_value = (unsigned_short *)0x0;
          local_88.codes = (uint *)0x0;
          local_88.lengths = (uint *)0x0;
          local_88.table_len = (uchar *)0x0;
          local_88.table_value = (unsigned_short *)0x0;
          if (uVar4 == 1) {
            local_118.bp = uVar9;
            uVar6 = generateFixedLitLenTree(&local_b8);
            p = local_e8;
            if (uVar6 == 0) {
              uVar6 = generateFixedDistanceTree(&local_88);
            }
          }
          else {
            local_118.bp = uVar9;
            uVar6 = ensureBits17(&local_118,0xe);
            uVar5 = local_118.buffer;
            if (uVar6 == 0) {
              uVar6 = 0x31;
              p = local_e8;
            }
            else {
              local_118.buffer = local_118.buffer >> 0xe;
              uVar9 = local_118.bp + 0xe;
              local_118.bp = uVar9;
              bitlen = (uint *)malloc(0x4c);
              if (bitlen == (uint *)0x0) {
                uVar6 = 0x53;
                p = local_e8;
              }
              else {
                uVar7 = (ulong)(uVar5 >> 10 & 0xf);
                local_58.codes = (uint *)0x0;
                local_58.lengths = (uint *)0x0;
                local_58.table_len = (uchar *)0x0;
                local_58.table_value = (unsigned_short *)0x0;
                uVar17 = (long)(uVar7 + 4) * 3 + uVar9;
                uVar6 = 0x32;
                if (uVar17 < uVar9) {
                  bitlen_00 = (uint *)0x0;
                  puVar8 = (uint *)0x0;
                }
                else {
                  bitlen_00 = (uint *)0x0;
                  puVar8 = (uint *)0x0;
                  if (uVar17 <= local_118.bitsize) {
                    local_e0 = (ulong)(uVar5 & 0x1f);
                    local_d0 = local_e0 + 0x101;
                    local_d8 = (ulong)((uVar5 >> 5 & 0x1f) + 1);
                    lVar15 = 0;
                    local_f0 = (uint *)(uVar7 + 4);
                    do {
                      ensureBits9(&local_118,3);
                      uVar5 = local_118.buffer & 7;
                      local_118.buffer = local_118.buffer >> 3;
                      local_118.bp = local_118.bp + 3;
                      bitlen[*(uint *)((long)CLCL_ORDER + lVar15)] = uVar5;
                      lVar15 = lVar15 + 4;
                    } while (uVar7 * 4 + 0x10 != lVar15);
                    if ((int)local_f0 != 0x13) {
                      do {
                        bitlen[CLCL_ORDER[uVar7 + 4]] = 0;
                        uVar7 = uVar7 + 1;
                      } while (uVar7 != 0xf);
                    }
                    uVar6 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
                    if (uVar6 == 0) {
                      puVar8 = (uint *)malloc(0x480);
                      bitlen_00 = (uint *)malloc(0x80);
                      uVar6 = 0x53;
                      if (bitlen_00 != (uint *)0x0 && puVar8 != (uint *)0x0) {
                        uVar6 = 0;
                        local_f0 = puVar8;
                        memset(puVar8,0,0x480);
                        bitlen_00[0] = 0;
                        bitlen_00[1] = 0;
                        bitlen_00[2] = 0;
                        bitlen_00[3] = 0;
                        bitlen_00[4] = 0;
                        bitlen_00[5] = 0;
                        bitlen_00[6] = 0;
                        bitlen_00[7] = 0;
                        bitlen_00[8] = 0;
                        bitlen_00[9] = 0;
                        bitlen_00[10] = 0;
                        bitlen_00[0xb] = 0;
                        bitlen_00[0xc] = 0;
                        bitlen_00[0xd] = 0;
                        bitlen_00[0xe] = 0;
                        bitlen_00[0xf] = 0;
                        bitlen_00[0x10] = 0;
                        bitlen_00[0x11] = 0;
                        bitlen_00[0x12] = 0;
                        bitlen_00[0x13] = 0;
                        bitlen_00[0x14] = 0;
                        bitlen_00[0x15] = 0;
                        bitlen_00[0x16] = 0;
                        bitlen_00[0x17] = 0;
                        bitlen_00[0x18] = 0;
                        bitlen_00[0x19] = 0;
                        bitlen_00[0x1a] = 0;
                        bitlen_00[0x1b] = 0;
                        bitlen_00[0x1c] = 0;
                        bitlen_00[0x1d] = 0;
                        bitlen_00[0x1e] = 0;
                        bitlen_00[0x1f] = 0;
                        uVar20 = (int)local_d8 + (int)local_d0;
                        uVar17 = (ulong)uVar20;
                        local_c4 = (int)local_e0 + 0x102;
                        uVar5 = -(int)local_e0;
                        local_e0 = (ulong)uVar5;
                        local_d8 = (long)(int)uVar5 - 0x101;
                        uVar9 = 0;
                        do {
                          uVar5 = (uint)uVar9;
                          if (uVar20 <= uVar5) break;
                          uVar7 = local_118.bp >> 3;
                          if (uVar7 + 3 < local_118.size) {
                            local_118.buffer = *(uint *)(local_118.data + uVar7);
                          }
                          else {
                            local_118.buffer = 0;
                            if (uVar7 < local_118.size) {
                              local_118.buffer = (uint)local_118.data[uVar7];
                            }
                            if (uVar7 + 1 < local_118.size) {
                              local_118.buffer =
                                   local_118.buffer | (uint)local_118.data[uVar7 + 1] << 8;
                            }
                            if (uVar7 + 2 < local_118.size) {
                              local_118.buffer =
                                   local_118.buffer | (uint)local_118.data[uVar7 + 2] << 0x10;
                            }
                          }
                          local_118.buffer = local_118.buffer >> ((byte)local_118.bp & 7);
                          uVar4 = huffmanDecodeSymbol(&local_118,&local_58);
                          if (uVar4 < 0x10) {
                            uVar11 = (uint)local_d0;
                            puVar8 = bitlen_00;
                            if (uVar5 < uVar11) {
                              uVar11 = 0;
                              puVar8 = local_f0;
                            }
                            puVar8[uVar5 - uVar11] = uVar4;
                            uVar9 = (ulong)(uVar5 + 1);
LAB_0011b4be:
                            if (local_118.bitsize < local_118.bp) {
                              uVar6 = 0x32;
                            }
                            iVar13 = 0;
                            if (local_118.bitsize < local_118.bp) {
                              iVar13 = 0xb;
                            }
                          }
                          else {
                            iVar13 = (int)local_d8;
                            if (uVar4 == 0x12) {
                              uVar5 = local_118.buffer >> 7;
                              local_118.bp = local_118.bp + 7;
                              uVar9 = uVar9 & 0xffffffff;
                              puVar8 = local_f0 + uVar9;
                              iVar12 = (local_118.buffer & 0x7f) + 0xb;
                              do {
                                local_118.buffer = uVar5;
                                if (uVar17 <= uVar9) {
                                  uVar6 = 0xf;
                                  break;
                                }
                                puVar14 = bitlen_00 + (uint)(iVar13 + (int)uVar9);
                                if (uVar9 < local_d0) {
                                  puVar14 = puVar8;
                                }
                                *puVar14 = 0;
                                uVar9 = uVar9 + 1;
                                puVar8 = puVar8 + 1;
                                iVar12 = iVar12 + -1;
                              } while (iVar12 != 0);
                              goto LAB_0011b4be;
                            }
                            if (uVar4 == 0x11) {
                              uVar5 = local_118.buffer >> 3;
                              local_118.bp = local_118.bp + 3;
                              uVar9 = uVar9 & 0xffffffff;
                              puVar8 = local_f0 + uVar9;
                              iVar12 = (local_118.buffer & 7) + 3;
                              do {
                                local_118.buffer = uVar5;
                                if (uVar17 <= uVar9) {
                                  uVar6 = 0xe;
                                  break;
                                }
                                puVar14 = bitlen_00 + (uint)(iVar13 + (int)uVar9);
                                if (uVar9 < local_d0) {
                                  puVar14 = puVar8;
                                }
                                *puVar14 = 0;
                                uVar9 = uVar9 + 1;
                                puVar8 = puVar8 + 1;
                                iVar12 = iVar12 + -1;
                              } while (iVar12 != 0);
                              goto LAB_0011b4be;
                            }
                            if (uVar4 == 0x10) {
                              if (uVar5 == 0) {
                                iVar13 = 0xb;
                                uVar4 = 0;
                                uVar6 = 0x36;
                              }
                              else {
                                local_118.bp = local_118.bp + 2;
                                puVar8 = bitlen_00 + ((uVar5 - 0x102) + (int)local_e0);
                                if (uVar5 < local_c4) {
                                  puVar8 = local_f0 + (uVar5 - 1);
                                }
                                uVar4 = *puVar8;
                                uVar9 = uVar9 & 0xffffffff;
                                puVar8 = local_f0 + uVar9;
                                iVar12 = (local_118.buffer & 3) + 3;
                                do {
                                  if (uVar17 <= uVar9) {
                                    uVar6 = 0xd;
                                    break;
                                  }
                                  puVar14 = bitlen_00 + (uint)(iVar13 + (int)uVar9);
                                  if (uVar9 < local_d0) {
                                    puVar14 = puVar8;
                                  }
                                  *puVar14 = uVar4;
                                  uVar9 = uVar9 + 1;
                                  puVar8 = puVar8 + 1;
                                  iVar12 = iVar12 + -1;
                                } while (iVar12 != 0);
                                uVar4 = (uint)uVar9;
                                iVar13 = 0;
                                local_118.buffer = local_118.buffer >> 2;
                              }
                              uVar9 = (ulong)uVar4;
                              if (uVar5 != 0) goto LAB_0011b4be;
                            }
                            else {
                              iVar13 = 0xb;
                              uVar6 = 0x10;
                            }
                          }
                        } while (iVar13 == 0);
                        puVar8 = local_f0;
                        if (uVar6 == 0) {
                          if (local_f0[0x100] == 0) {
                            uVar6 = 0x40;
                          }
                          else {
                            uVar6 = HuffmanTree_makeFromLengths(&local_b8,local_f0,0x120,0xf);
                            puVar8 = local_f0;
                            if (uVar6 == 0) {
                              uVar6 = HuffmanTree_makeFromLengths(&local_88,bitlen_00,0x20,0xf);
                              puVar8 = local_f0;
                            }
                          }
                        }
                      }
                    }
                    else {
                      bitlen_00 = (uint *)0x0;
                      puVar8 = (uint *)0x0;
                    }
                  }
                }
                free(bitlen);
                free(puVar8);
                free(bitlen_00);
                HuffmanTree_cleanup(&local_58);
                p = local_e8;
              }
            }
          }
          do {
            if (uVar6 != 0) break;
            uVar9 = local_118.bp >> 3;
            if (uVar9 + 3 < local_118.size) {
              local_118.buffer = *(uint *)(local_118.data + uVar9);
            }
            else {
              local_118.buffer = 0;
              if (uVar9 < local_118.size) {
                local_118.buffer = (uint)local_118.data[uVar9];
              }
              if (uVar9 + 1 < local_118.size) {
                local_118.buffer = local_118.buffer | (uint)local_118.data[uVar9 + 1] << 8;
              }
              if (uVar9 + 2 < local_118.size) {
                local_118.buffer = local_118.buffer | (uint)local_118.data[uVar9 + 2] << 0x10;
              }
            }
            local_118.buffer = local_118.buffer >> ((byte)local_118.bp & 7);
            uVar5 = huffmanDecodeSymbol(&local_118,&local_b8);
            if (uVar5 < 0x100) {
              uVar20 = ucvector_resize(p,p->size + 1);
              if (uVar20 == 0) {
                uVar6 = 0x53;
LAB_0011b82c:
                cVar18 = '\x03';
              }
              else {
                p->data[p->size - 1] = (uchar)uVar5;
LAB_0011b9a9:
                cVar18 = (local_118.bitsize < local_118.bp) * '\x03';
                if (local_118.bitsize < local_118.bp) {
                  uVar6 = 0x33;
                }
              }
            }
            else {
              if (0x11d < uVar5 || uVar5 == 0x100) {
                if (uVar5 != 0x100) {
                  uVar6 = 0x10;
                }
                goto LAB_0011b82c;
              }
              uVar9 = (ulong)(uVar5 - 0x101);
              uVar17 = (ulong)LENGTHBASE[uVar9];
              if (0xffffffffffffffeb < uVar9 - 0x1c) {
                local_118.bp = local_118.bp + LENGTHEXTRA[uVar9];
                uVar17 = uVar17 + (~(-1 << ((byte)LENGTHEXTRA[uVar9] & 0x1f)) & local_118.buffer);
              }
              uVar9 = local_118.bp >> 3;
              if (uVar9 + 4 < local_118.size) {
                bVar10 = (byte)local_118.bp & 7;
                local_118.buffer =
                     ((uint)local_118.data[uVar9 + 4] << 0x18) << (8 - bVar10 & 0x1f) |
                     *(uint *)(local_118.data + uVar9) >> bVar10;
              }
              else {
                local_118.buffer = 0;
                if (uVar9 < local_118.size) {
                  local_118.buffer = (uint)local_118.data[uVar9];
                }
                if (uVar9 + 1 < local_118.size) {
                  local_118.buffer = local_118.buffer | (uint)local_118.data[uVar9 + 1] << 8;
                }
                if (uVar9 + 2 < local_118.size) {
                  local_118.buffer = local_118.buffer | (uint)local_118.data[uVar9 + 2] << 0x10;
                }
                if (uVar9 + 3 < local_118.size) {
                  local_118.buffer = local_118.buffer | (uint)local_118.data[uVar9 + 3] << 0x18;
                }
                local_118.buffer = local_118.buffer >> ((byte)local_118.bp & 7);
              }
              uVar5 = huffmanDecodeSymbol(&local_118,&local_88);
              if (uVar5 < 0x1e) {
                uVar20 = DISTANCEBASE[uVar5];
                if (3 < uVar5) {
                  bVar10 = (byte)DISTANCEEXTRA[uVar5];
                  uVar4 = ~(-1 << (bVar10 & 0x1f)) & local_118.buffer;
                  local_118.buffer = local_118.buffer >> (bVar10 & 0x1f);
                  local_118.bp = local_118.bp + DISTANCEEXTRA[uVar5];
                  uVar20 = uVar20 + uVar4;
                }
                uVar9 = p->size;
                uVar7 = (ulong)uVar20;
                cVar18 = '\x03';
                lVar15 = uVar9 - uVar7;
                if (uVar9 < uVar7) {
                  uVar6 = 0x34;
                }
                else {
                  uVar5 = ucvector_resize(p,uVar9 + uVar17);
                  if (uVar5 != 0) {
                    lVar19 = uVar17 - uVar7;
                    if (uVar17 < uVar7 || lVar19 == 0) {
                      cVar18 = '\0';
                      bVar21 = true;
                      if (uVar17 != 0) {
                        memcpy(local_e8->data + uVar9,local_e8->data + lVar15,uVar17);
                      }
                    }
                    else {
                      if (uVar7 != 0) {
                        memcpy(local_e8->data + uVar9,local_e8->data + lVar15,uVar7);
                      }
                      lVar16 = uVar9 + uVar7;
                      do {
                        puVar1 = local_e8->data + lVar15;
                        lVar15 = lVar15 + 1;
                        local_e8->data[lVar16] = *puVar1;
                        lVar16 = lVar16 + 1;
                        lVar19 = lVar19 + -1;
                      } while (lVar19 != 0);
                      cVar18 = '\0';
                      bVar21 = true;
                    }
                    goto LAB_0011b99f;
                  }
                  uVar6 = 0x53;
                }
                bVar21 = false;
              }
              else {
                uVar6 = (uint)(uVar5 < 0x20) * 2 + 0x10;
                cVar18 = '\x03';
                bVar21 = false;
              }
LAB_0011b99f:
              p = local_e8;
              if (bVar21) goto LAB_0011b9a9;
            }
          } while (cVar18 == '\0');
          HuffmanTree_cleanup(&local_b8);
          HuffmanTree_cleanup(&local_88);
        }
        bVar21 = uVar6 == 0;
        uVar20 = local_c0;
        uVar5 = local_bc;
        if (!bVar21) {
          uVar5 = uVar6;
        }
      }
    } while (bVar21);
  }
  return uVar5;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if(error) return error;
  }

  return error;
}